

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreIncTestInt64(void)

{
  bool expected;
  long t;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 0x10; lVar2 != 0x1a8; lVar2 = lVar2 + 0x18) {
    t = *(long *)(&UNK_00159bf0 + lVar2);
    si.m_int = t;
    pSVar1 = SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
             operator++(&si);
    expected = *(bool *)((long)&inc_int64 + lVar2);
    if ((pSVar1->m_int == *(long *)(&UNK_00159bf8 + lVar2)) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case inc_int64 throw (1): ",&local_51);
      err_msg<long>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreIncTestInt64()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int64_t > si(inc_int64[i].x);
			SafeInt< std::int64_t > vv = ++si;

			if(vv != inc_int64[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int64[i].fExpected )
		{
			err_msg( "Error in case inc_int64 throw (1): ", inc_int64[i].x, inc_int64[i].fExpected );
		}
	}
}